

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O3

int Cbs0_ManSolve(Cbs0_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  long lVar10;
  
  if (((p->pProp).iHead != 0) || ((p->pProp).iTail != 0)) {
    __assert_fail("!p->pProp.iHead && !p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                  ,0x289,"int Cbs0_ManSolve(Cbs0_Man_t *, Gia_Obj_t *)");
  }
  if (((p->pJust).iHead != 0) || ((p->pJust).iTail != 0)) {
    __assert_fail("!p->pJust.iHead && !p->pJust.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                  ,0x28a,"int Cbs0_ManSolve(Cbs0_Man_t *, Gia_Obj_t *)");
  }
  (p->Pars).nBTThis = 0;
  (p->Pars).nJustThis = 0;
  Cbs0_ManAssign(p,pObj);
  iVar6 = Cbs0_ManSolve_rec(p);
  if (((iVar6 == 0) && ((p->Pars).nJustThis <= (p->Pars).nJustLimit)) &&
     ((p->Pars).nBTThis <= (p->Pars).nBTLimit)) {
    pVVar3 = p->vModel;
    pVVar3->nSize = 0;
    (p->pProp).iHead = 0;
    iVar7 = (p->pProp).iTail;
    if (iVar7 < 1) goto LAB_0071ae8a;
    lVar10 = 0;
    do {
      pGVar4 = (p->pProp).pData[lVar10];
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar5 = *(ulong *)pGVar4;
      if ((~(uint)uVar5 & 0x9fffffff) == 0) {
        if (((uint)uVar5 >> 0x1e & 1) == 0) {
          __assert_fail("pVar->fMark0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                        ,0x55,"int Cbs0_VarValue(Gia_Obj_t *)");
        }
        uVar1 = pVVar3->nSize;
        if (uVar1 == pVVar3->nCap) {
          if ((int)uVar1 < 0x10) {
            if (pVVar3->pArray == (int *)0x0) {
              piVar9 = (int *)malloc(0x40);
            }
            else {
              piVar9 = (int *)realloc(pVVar3->pArray,0x40);
            }
            pVVar3->pArray = piVar9;
            if (piVar9 == (int *)0x0) {
LAB_0071afab:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            pVVar3->nCap = 0x10;
          }
          else {
            if (pVVar3->pArray == (int *)0x0) {
              piVar9 = (int *)malloc((ulong)uVar1 * 8);
            }
            else {
              piVar9 = (int *)realloc(pVVar3->pArray,(ulong)uVar1 * 8);
            }
            pVVar3->pArray = piVar9;
            if (piVar9 == (int *)0x0) goto LAB_0071afab;
            pVVar3->nCap = uVar1 * 2;
          }
        }
        else {
          piVar9 = pVVar3->pArray;
        }
        iVar7 = pVVar3->nSize;
        pVVar3->nSize = iVar7 + 1;
        piVar9[iVar7] = ((uint)(uVar5 >> 0x1f) & 0x3ffffffe | (uint)(uVar5 >> 0x3e) & 1) ^ 1;
        iVar7 = (p->pProp).iTail;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar7);
  }
  iVar7 = (p->pProp).iTail;
LAB_0071ae8a:
  if (iVar7 < 0) {
    __assert_fail("iBound <= p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                  ,0x1aa,"void Cbs0_ManCancelUntil(Cbs0_Man_t *, int)");
  }
  (p->pProp).iHead = 0;
  if (iVar7 != 0) {
    lVar10 = 0;
    do {
      pGVar4 = (p->pProp).pData[lVar10];
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      if (((uint)*(ulong *)pGVar4 >> 0x1e & 1) == 0) {
        __assert_fail("pVar->fMark0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                      ,0x54,"void Cbs0_VarUnassign(Gia_Obj_t *)");
      }
      *(ulong *)pGVar4 = *(ulong *)pGVar4 & 0xbfffffffbfffffff;
      lVar10 = lVar10 + 1;
    } while (lVar10 < (p->pProp).iTail);
  }
  (p->pProp).iTail = 0;
  (p->pJust).iHead = 0;
  (p->pJust).iTail = 0;
  iVar7 = (p->Pars).nBTThis;
  iVar2 = (p->Pars).nJustThis;
  piVar9 = &(p->Pars).nBTTotal;
  *piVar9 = *piVar9 + iVar7;
  iVar8 = (p->Pars).nJustTotal;
  if (iVar8 <= iVar2) {
    iVar8 = iVar2;
  }
  (p->Pars).nJustTotal = iVar8;
  iVar8 = -1;
  if ((iVar2 <= (p->Pars).nJustLimit) && (iVar8 = -1, iVar7 <= (p->Pars).nBTLimit)) {
    iVar8 = iVar6;
  }
  return iVar8;
}

Assistant:

int Cbs0_ManSolve( Cbs0_Man_t * p, Gia_Obj_t * pObj )
{
    int RetValue;
    assert( !p->pProp.iHead && !p->pProp.iTail );
    assert( !p->pJust.iHead && !p->pJust.iTail );
    p->Pars.nBTThis = p->Pars.nJustThis = 0;
    Cbs0_ManAssign( p, pObj );
    RetValue = Cbs0_ManSolve_rec( p );
    if ( RetValue == 0 && !Cbs0_ManCheckLimits(p) )
        Cbs0_ManSaveModel( p, p->vModel );
    Cbs0_ManCancelUntil( p, 0 );
    p->pJust.iHead = p->pJust.iTail = 0;
    p->Pars.nBTTotal += p->Pars.nBTThis;
    p->Pars.nJustTotal = Abc_MaxInt( p->Pars.nJustTotal, p->Pars.nJustThis );
    if ( Cbs0_ManCheckLimits( p ) )
        RetValue = -1;
//    printf( "Outcome = %2d.  Confs = %6d.  Decision level max = %3d.\n", 
//        RetValue, p->Pars.nBTThis, p->DecLevelMax );
    return RetValue;
}